

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_paddw_mips64(uint64_t fs,uint64_t ft)

{
  int *piVar1;
  long lVar2;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar2 = 0;
  do {
    piVar1 = (int *)((long)&vs + lVar2 * 4);
    *piVar1 = *piVar1 + *(int *)((long)&vt + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return vs.d;
}

Assistant:

uint64_t helper_paddw(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 2; ++i) {
        vs.uw[i] += vt.uw[i];
    }
    return vs.d;
}